

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool google::protobuf::compiler::anon_unknown_5::TryCreateParentDirectory
               (string *prefix,string *filename)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  char *pcVar4;
  int *piVar5;
  ostream *poVar6;
  ulong local_f0;
  size_t i;
  string path_so_far;
  string_view local_b0;
  ByAnyChar local_a0;
  ConvertibleToStringView local_80;
  Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_70;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  string *filename_local;
  string *prefix_local;
  
  parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = filename;
  absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
            (&local_80,filename);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0,"/\\");
  absl::lts_20250127::ByAnyChar::ByAnyChar(&local_a0,local_b0);
  absl::lts_20250127::StrSplit<absl::lts_20250127::ByAnyChar,absl::lts_20250127::SkipEmpty>
            (&local_70,(lts_20250127 *)local_80.value_._M_len,local_80.value_._M_str,&local_a0);
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38,&local_70);
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::~Splitter(&local_70);
  absl::lts_20250127::ByAnyChar::~ByAnyChar(&local_a0);
  std::__cxx11::string::string((string *)&i,(string *)prefix);
  local_f0 = 0;
  do {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38);
    if (sVar2 - 1 <= local_f0) {
      prefix_local._7_1_ = true;
LAB_002493d7:
      std::__cxx11::string::~string((string *)&i);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_38);
      return prefix_local._7_1_;
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_38,local_f0);
    std::__cxx11::string::operator+=((string *)&i,(string *)pvVar3);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar1 = mkdir(pcVar4,0x1ff);
    if ((iVar1 != 0) && (piVar5 = __errno_location(), *piVar5 != 0x11)) {
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               (string *)
                               parts.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar6 = std::operator<<(poVar6,": while trying to create directory ");
      poVar6 = std::operator<<(poVar6,(string *)&i);
      poVar6 = std::operator<<(poVar6,": ");
      piVar5 = __errno_location();
      pcVar4 = strerror(*piVar5);
      poVar6 = std::operator<<(poVar6,pcVar4);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      prefix_local._7_1_ = false;
      goto LAB_002493d7;
    }
    std::__cxx11::string::operator+=((string *)&i,'/');
    local_f0 = local_f0 + 1;
  } while( true );
}

Assistant:

bool TryCreateParentDirectory(const std::string& prefix,
                              const std::string& filename) {
  // Recursively create parent directories to the output file.
  // On Windows, both '/' and '\' are valid path separators.
  std::vector<std::string> parts =
      absl::StrSplit(filename, absl::ByAnyChar("/\\"), absl::SkipEmpty());
  std::string path_so_far = prefix;
  for (size_t i = 0; i < parts.size() - 1; ++i) {
    path_so_far += parts[i];
    if (mkdir(path_so_far.c_str(), 0777) != 0) {
      if (errno != EEXIST) {
        std::cerr << filename << ": while trying to create directory "
                  << path_so_far << ": " << strerror(errno) << std::endl;
        return false;
      }
    }
    path_so_far += '/';
  }

  return true;
}